

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int str_char(lua_State *L)

{
  lua_Integer lVar1;
  undefined1 auStack_2030 [4];
  int c;
  luaL_Buffer b;
  int i;
  int n;
  lua_State *L_local;
  
  b.buffer._8188_4_ = lua_gettop(L);
  luaL_buffinit(L,(luaL_Buffer *)auStack_2030);
  b.buffer[0x1ff8] = '\x01';
  b.buffer[0x1ff9] = '\0';
  b.buffer[0x1ffa] = '\0';
  b.buffer[0x1ffb] = '\0';
  for (; (int)b.buffer._8184_4_ <= (int)b.buffer._8188_4_; b.buffer._8184_4_ = b.buffer._8184_4_ + 1
      ) {
    lVar1 = luaL_checkinteger(L,b.buffer._8184_4_);
    if (((uint)lVar1 & 0xff) != (uint)lVar1) {
      luaL_argerror(L,b.buffer._8184_4_,"invalid value");
    }
    if (b.buffer + 0x1ff8 <= _auStack_2030) {
      luaL_prepbuffer((luaL_Buffer *)auStack_2030);
    }
    *_auStack_2030 = (char)lVar1;
    _auStack_2030 = _auStack_2030 + 1;
  }
  luaL_pushresult((luaL_Buffer *)auStack_2030);
  return 1;
}

Assistant:

static int str_char(lua_State*L){
int n=lua_gettop(L);
int i;
luaL_Buffer b;
luaL_buffinit(L,&b);
for(i=1;i<=n;i++){
int c=luaL_checkint(L,i);
luaL_argcheck(L,uchar(c)==c,i,"invalid value");
luaL_addchar(&b,uchar(c));
}
luaL_pushresult(&b);
return 1;
}